

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O0

error_code __thiscall
simdjson::haswell::implementation::create_dom_parser_implementation
          (implementation *this,size_t capacity,size_t max_depth,
          unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
          *dst)

{
  bool bVar1;
  dom_parser_implementation *this_00;
  pointer pdVar2;
  dom_parser_implementation *local_48;
  error_code err_1;
  error_code err;
  unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
  *dst_local;
  size_t max_depth_local;
  size_t capacity_local;
  implementation *this_local;
  
  this_00 = (dom_parser_implementation *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  local_48 = (dom_parser_implementation *)0x0;
  if (this_00 != (dom_parser_implementation *)0x0) {
    dom_parser_implementation::dom_parser_implementation(this_00);
    local_48 = this_00;
  }
  std::
  unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
  ::reset(dst,&local_48->super_dom_parser_implementation);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)dst);
  if (bVar1) {
    pdVar2 = std::
             unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             ::operator->(dst);
    this_local._4_4_ = (*pdVar2->_vptr_dom_parser_implementation[4])(pdVar2,capacity);
    if (this_local._4_4_ == SUCCESS) {
      pdVar2 = std::
               unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
               ::operator->(dst);
      this_local._4_4_ = (*pdVar2->_vptr_dom_parser_implementation[5])(pdVar2,max_depth);
      if (this_local._4_4_ == SUCCESS) {
        this_local._4_4_ = SUCCESS;
      }
    }
  }
  else {
    this_local._4_4_ = MEMALLOC;
  }
  return this_local._4_4_;
}

Assistant:

simdjson_warn_unused error_code implementation::create_dom_parser_implementation(
  size_t capacity,
  size_t max_depth,
  std::unique_ptr<internal::dom_parser_implementation>& dst
) const noexcept {
  dst.reset( new (std::nothrow) dom_parser_implementation() );
  if (!dst) { return MEMALLOC; }
  if (auto err = dst->set_capacity(capacity))
    return err;
  if (auto err = dst->set_max_depth(max_depth))
    return err;
  return SUCCESS;
}